

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O3

string * __thiscall
embree::to_string_abi_cxx11_(string *__return_storage_ptr__,embree *this,RTCFeatureFlags features)

{
  int iVar1;
  uint uVar2;
  _Alloc_hider local_38;
  size_type local_30;
  size_type local_28;
  undefined8 uStack_20;
  
  local_38._M_p = (pointer)&local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  if (((ulong)this & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if (((ulong)this & 2) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if (((ulong)this & 4) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if (((ulong)this & 8) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if (((ulong)this & 0x10) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if (((ulong)this & 0x20) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if (((ulong)this & 0x40) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((char)((ulong)this & 0xffffffff) < '\0') {
    std::__cxx11::string::append((char *)&local_38);
  }
  uVar2 = (uint)this;
  if ((uVar2 >> 8 & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 9 & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 10 & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((short)((ulong)this & 0xffffffff) < 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0x12 & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0x13 & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0x14 & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0x15 & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0x16 & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0x17 & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0x1d & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0x18 & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0x19 & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0x1a & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  if ((uVar2 >> 0x1b & 1) != 0) {
    std::__cxx11::string::append((char *)&local_38);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (iVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"NONE","");
    if ((size_type *)local_38._M_p != &local_28) {
      operator_delete(local_38._M_p);
    }
  }
  else {
    if ((size_type *)local_38._M_p == &local_28) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_28;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_20;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_28;
    }
    __return_storage_ptr__->_M_string_length = local_30;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(RTCFeatureFlags features)
  {
    std::string out = "";
    if (features & RTC_FEATURE_FLAG_MOTION_BLUR) out += "MOTION_BLUR";
    if (features & RTC_FEATURE_FLAG_TRIANGLE) out += "TRIANGLE ";
    if (features & RTC_FEATURE_FLAG_QUAD) out += "QUAD ";
    if (features & RTC_FEATURE_FLAG_GRID) out += "GRID ";
    if (features & RTC_FEATURE_FLAG_SUBDIVISION) out += "SUBDIVISION ";
    if (features & RTC_FEATURE_FLAG_CONE_LINEAR_CURVE) out += "CONE_LINEAR_CURVE ";
    if (features & RTC_FEATURE_FLAG_ROUND_LINEAR_CURVE ) out += "ROUND_LINEAR_CURVE ";
    if (features & RTC_FEATURE_FLAG_FLAT_LINEAR_CURVE) out += "FLAT_LINEAR_CURVE ";
    if (features & RTC_FEATURE_FLAG_ROUND_BEZIER_CURVE) out += "ROUND_BEZIER_CURVE ";
    if (features & RTC_FEATURE_FLAG_FLAT_BEZIER_CURVE) out += "FLAT_BEZIER_CURVE ";
    if (features & RTC_FEATURE_FLAG_NORMAL_ORIENTED_BEZIER_CURVE) out += "NORMAL_ORIENTED_BEZIER_CURVE ";
    if (features & RTC_FEATURE_FLAG_ROUND_BSPLINE_CURVE) out += "ROUND_BSPLINE_CURVE ";
    if (features & RTC_FEATURE_FLAG_FLAT_BSPLINE_CURVE) out += "FLAT_BSPLINE_CURVE ";
    if (features & RTC_FEATURE_FLAG_NORMAL_ORIENTED_BSPLINE_CURVE) out += "NORMAL_ORIENTED_BSPLINE_CURVE ";
    if (features & RTC_FEATURE_FLAG_ROUND_HERMITE_CURVE) out += "ROUND_HERMITE_CURVE ";
    if (features & RTC_FEATURE_FLAG_FLAT_HERMITE_CURVE) out += "FLAT_HERMITE_CURVE ";
    if (features & RTC_FEATURE_FLAG_NORMAL_ORIENTED_HERMITE_CURVE) out += "NORMAL_ORIENTED_HERMITE_CURVE ";
    if (features & RTC_FEATURE_FLAG_ROUND_CATMULL_ROM_CURVE) out += "ROUND_CATMULL_ROM_CURVE ";
    if (features & RTC_FEATURE_FLAG_FLAT_CATMULL_ROM_CURVE) out += "FLAT_CATMULL_ROM_CURVE ";
    if (features & RTC_FEATURE_FLAG_NORMAL_ORIENTED_CATMULL_ROM_CURVE) out += "NORMAL_ORIENTED_CATMULL_ROM_CURVE ";
    if (features & RTC_FEATURE_FLAG_SPHERE_POINT) out += "SPHERE_POINT ";
    if (features & RTC_FEATURE_FLAG_DISC_POINT) out += "DISC_POINT ";
    if (features & RTC_FEATURE_FLAG_ORIENTED_DISC_POINT) out += "ORIENTED_DISC_POINT ";
    if (features & RTC_FEATURE_FLAG_INSTANCE) out += "INSTANCE ";
    if (features & RTC_FEATURE_FLAG_INSTANCE_ARRAY) out += "INSTANCE_ARRAY ";
    if (features & RTC_FEATURE_FLAG_FILTER_FUNCTION_IN_ARGUMENTS) out += "FILTER_FUNCTION_IN_ARGUMENTS ";
    if (features & RTC_FEATURE_FLAG_FILTER_FUNCTION_IN_GEOMETRY) out += "FILTER_FUNCTION_IN_GEOMETRY ";
    if (features & RTC_FEATURE_FLAG_USER_GEOMETRY_CALLBACK_IN_ARGUMENTS) out += "USER_GEOMETRY_CALLBACK_IN_ARGUMENTS ";
    if (features & RTC_FEATURE_FLAG_USER_GEOMETRY_CALLBACK_IN_GEOMETRY) out += "USER_GEOMETRY_CALLBACK_IN_GEOMETRY ";
    if (out == "") return "NONE";
    return out;
  }